

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O3

void Fra_ClassesSelectRepr(Fra_Cla_t *p)

{
  long *plVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  Aig_Obj_t *pObj;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  
  pVVar3 = p->vClasses;
  if (0 < pVVar3->nSize) {
    lVar7 = 0;
    do {
      plVar1 = (long *)pVVar3->pArray[lVar7];
      pObj = (Aig_Obj_t *)*plVar1;
      if (pObj == (Aig_Obj_t *)0x0) {
        plVar1[-1] = *plVar1;
      }
      else {
        uVar9 = 0xffffffff;
        iVar10 = 1000000000;
        uVar6 = 0;
        lVar8 = 0;
        do {
          iVar2 = Aig_SupportSize(p->pAig,pObj);
          if (iVar2 < iVar10) {
            lVar4 = plVar1[uVar6];
LAB_0090e19f:
            uVar9 = uVar6 & 0xffffffff;
            lVar8 = lVar4;
            iVar10 = iVar2;
          }
          else if ((iVar10 == iVar2) &&
                  (lVar4 = plVar1[uVar6],
                  (*(uint *)(lVar4 + 0x1c) & 0xffffff) < (*(uint *)(lVar8 + 0x1c) & 0xffffff)))
          goto LAB_0090e19f;
          pObj = (Aig_Obj_t *)plVar1[uVar6 + 1];
          uVar6 = uVar6 + 1;
        } while (pObj != (Aig_Obj_t *)0x0);
        if ((int)uVar9 != 0) {
          plVar1[(int)uVar9] = *plVar1;
          *plVar1 = lVar8;
          if (lVar8 != 0) {
            lVar4 = 1;
            do {
              if (lVar4 == 1) {
                lVar5 = 0;
              }
              else {
                lVar5 = *plVar1;
              }
              *(long *)(*(long *)(*(long *)(*(long *)(lVar8 + 0x28) + 0x30) + 8) +
                       (long)*(int *)(lVar8 + 0x24) * 8) = lVar5;
              lVar8 = plVar1[lVar4];
              lVar4 = lVar4 + 1;
            } while (lVar8 != 0);
          }
        }
      }
      lVar7 = lVar7 + 1;
      pVVar3 = p->vClasses;
    } while (lVar7 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Fra_ClassesSelectRepr( Fra_Cla_t * p )
{
    Aig_Obj_t ** pClass, * pNodeMin;
    int i, c, cMinSupp, nSuppSizeMin, nSuppSizeCur;
    // reassign representatives in each class
    Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
    {
        // collect support sizes and find the min-support node
        cMinSupp = -1;
        pNodeMin = NULL;
        nSuppSizeMin = ABC_INFINITY;
        for ( c = 0; pClass[c]; c++ )
        {
            nSuppSizeCur = Aig_SupportSize( p->pAig, pClass[c] );
//            nSuppSizeCur = 1;
            if ( nSuppSizeMin > nSuppSizeCur || 
                (nSuppSizeMin == nSuppSizeCur && pNodeMin->Level > pClass[c]->Level) )
            {
                nSuppSizeMin = nSuppSizeCur;
                pNodeMin = pClass[c];
                cMinSupp = c; 
            }
        }
        // skip the case when the repr did not change
        if ( cMinSupp == 0 )
            continue;
        // make the new node the representative of the class
        pClass[cMinSupp] = pClass[0];
        pClass[0] = pNodeMin;
        // set the representative
        for ( c = 0; pClass[c]; c++ )
            Fra_ClassObjSetRepr( pClass[c], c? pClass[0] : NULL );
    }
}